

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlNodeSet.cpp
# Opt level: O0

iterator __thiscall opencollada::XmlNodeSet::begin(XmlNodeSet *this)

{
  long *in_RDI;
  iterator iVar1;
  undefined1 local_10 [12];
  
  if (*in_RDI == 0) {
    memset(local_10,0,0x10);
    iterator::iterator((iterator *)local_10);
  }
  else if (*(long *)(*in_RDI + 8) == 0) {
    memset(local_10,0,0x10);
    iterator::iterator((iterator *)local_10);
  }
  else if (**(int **)(*in_RDI + 8) == 0) {
    memset(local_10,0,0x10);
    iterator::iterator((iterator *)local_10);
  }
  else {
    iterator::iterator((iterator *)local_10,*(xmlNodeSetPtr *)(*in_RDI + 8));
  }
  iVar1._12_4_ = 0;
  iVar1.mNodeSet = (xmlNodeSetPtr)local_10._0_8_;
  iVar1.mIndex = local_10._8_4_;
  return iVar1;
}

Assistant:

XmlNodeSet::iterator XmlNodeSet::begin() const
	{
		if (!mXPathObject)
			return iterator();
		if (!mXPathObject->nodesetval)
			return iterator();
		if (mXPathObject->nodesetval->nodeNr == 0)
			return iterator();
		return iterator(mXPathObject->nodesetval);
	}